

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosComm.cpp
# Opt level: O0

int __thiscall adios2::helper::Comm::Win::Free(Win *this,string *hint)

{
  bool bVar1;
  pointer pCVar2;
  undefined8 in_RSI;
  unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_> *in_RDI
  ;
  int status;
  pointer in_stack_ffffffffffffffd8;
  int local_14;
  
  local_14 = 0;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
                      *)0x97f5d5);
  if (bVar1) {
    pCVar2 = std::
             unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
             ::operator->((unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
                           *)0x97f5e5);
    local_14 = (*pCVar2->_vptr_CommWinImpl[2])(pCVar2,in_RSI);
    std::unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
    ::reset(in_RDI,in_stack_ffffffffffffffd8);
  }
  return local_14;
}

Assistant:

int Comm::Win::Free(const std::string &hint)
{
    int status = 0;
    if (m_Impl)
    {
        status = m_Impl->Free(hint);
        m_Impl.reset();
    }
    return status;
}